

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_expression_delete.hpp
# Opt level: O2

void __thiscall optimization::common_expr_del::Node::init_main_var(Node *this)

{
  list<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *plVar1;
  Value *pVVar2;
  mapped_type *pmVar3;
  _List_node_base *p_Var4;
  VarId var;
  undefined **local_68;
  key_type_conflict local_60 [2];
  VarId local_58;
  undefined1 local_48 [16];
  key_type_conflict local_38;
  undefined1 local_30;
  undefined2 local_2f;
  
  if ((this->value).super__Optional_base<mir::inst::Value,_false,_false>._M_payload.
      super__Optional_payload_base<mir::inst::Value>._M_engaged == true) {
    pVVar2 = std::optional<mir::inst::Value>::value(&this->value);
    mir::inst::Value::operator=(&this->mainVar,pVVar2);
    return;
  }
  plVar1 = &this->live_vars;
  p_Var4 = (_List_node_base *)plVar1;
  while (p_Var4 = (((_List_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                   &p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var4 != (_List_node_base *)plVar1) {
    local_68 = &PTR_display_001d90d0;
    local_60[0] = *(key_type_conflict *)&p_Var4[1]._M_prev;
    pmVar3 = std::
             map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
             ::at(&env->func->variables,local_60);
    if (pmVar3->is_phi_var != true) {
      local_48._8_8_ = &PTR_display_001d90d0;
      local_38 = local_60[0];
      local_30 = 1;
      local_48._0_8_ = &PTR_display_001dafa8;
      local_2f._0_1_ = Lsl;
      local_2f._1_1_ = '\0';
      mir::inst::Value::operator=(&this->mainVar,(Value *)local_48);
      std::__cxx11::list<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::remove
                (plVar1,(char *)&local_68);
      return;
    }
  }
  if ((this->local_vars).super__List_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
      _M_impl._M_node._M_size != 0) {
    plVar1 = &this->local_vars;
    local_38 = *(key_type_conflict *)
                &(this->local_vars).
                 super__List_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
                 _M_node.super__List_node_base._M_next[1]._M_prev;
    local_48._8_8_ = &PTR_display_001d90d0;
    local_30 = 1;
    local_48._0_8_ = &PTR_display_001dafa8;
    local_2f._0_1_ = Lsl;
    local_2f._1_1_ = '\0';
    mir::inst::Value::operator=(&this->mainVar,(Value *)local_48);
    std::__cxx11::list<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::pop_front(plVar1);
    p_Var4 = (_List_node_base *)plVar1;
    while (p_Var4 = (((_List_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                     &p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var4 != (_List_node_base *)plVar1) {
      local_58.id = *(uint32_t *)&p_Var4[1]._M_prev;
      local_58.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
      Env::remove_var(env,&local_58);
    }
    return;
  }
  if ((this->live_vars).super__List_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
      _M_impl._M_node._M_size == 0) {
    return;
  }
  local_38 = *(key_type_conflict *)
              &(this->live_vars).
               super__List_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl._M_node
               .super__List_node_base._M_next[1]._M_prev;
  local_48._8_8_ = &PTR_display_001d90d0;
  local_30 = 1;
  local_48._0_8_ = &PTR_display_001dafa8;
  local_2f._0_1_ = Lsl;
  local_2f._1_1_ = '\0';
  mir::inst::Value::operator=(&this->mainVar,(Value *)local_48);
  std::__cxx11::list<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::pop_front(plVar1);
  return;
}

Assistant:

void init_main_var() {
    if (value.has_value()
        // && value->index() == 0 ||
        //     value.has_value() && value->index() == 1 &&
        //         std::get<mir::inst::VarId>(value.value()).id > 10000
    ) {
      mainVar = value.value();
    } else {
      for (auto var : live_vars) {
        if (!env->func.variables.at(var.id).is_phi_var) {
          mainVar = var;
          live_vars.remove(var);
          return;
        }
      }
      if (local_vars.size()) {
        // assert(local_vars.size()); store inst has no dest
        mainVar = local_vars.front();
        local_vars.pop_front();
        for (auto var : local_vars) {
          env->remove_var(var);
        }
      } else if (live_vars.size()) {  // add new var (store op has no local or
                                      // live vars)
        // mainVar = env->copy_var(live_vars.front());
        mainVar = live_vars.front();
        live_vars.pop_front();
      }
    }
  }